

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_x509.cc
# Opt level: O0

int i2d_X509(X509 *x509,uint8_t **outp)

{
  int iVar1;
  int iVar2;
  cbb_st *pcVar3;
  int len;
  uint8_t *out;
  undefined1 local_80 [8];
  CBB cert;
  ScopedCBB cbb;
  uint8_t **outp_local;
  X509 *x509_local;
  
  if (x509 == (X509 *)0x0) {
    ERR_put_error(0xc,0,0x9b,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x_x509.cc"
                  ,0xd9);
    return -1;
  }
  bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::StackAllocated
            ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)((long)&cert.u + 0x18));
  pcVar3 = bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                     ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                      ((long)&cert.u + 0x18));
  iVar1 = CBB_init(pcVar3,0x40);
  if (iVar1 != 0) {
    pcVar3 = bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                       ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                        ((long)&cert.u + 0x18));
    iVar1 = CBB_add_asn1(pcVar3,(CBB *)local_80,0x20000010);
    if (iVar1 != 0) {
      iVar1 = i2d_X509_CINF((X509_CINF *)x509->cert_info,(uchar **)0x0);
      if ((((iVar1 < 0) ||
           (iVar2 = CBB_add_space((CBB *)local_80,(uint8_t **)&stack0xffffffffffffff70,(long)iVar1),
           iVar2 == 0)) ||
          (iVar2 = i2d_X509_CINF((X509_CINF *)x509->cert_info,(uchar **)&stack0xffffffffffffff70),
          iVar2 != iVar1)) ||
         ((iVar1 = x509_marshal_algorithm((CBB *)local_80,x509->sig_alg), iVar1 == 0 ||
          (iVar1 = asn1_marshal_bit_string((CBB *)local_80,x509->signature,0), iVar1 == 0)))) {
        x509_local._4_4_ = -1;
      }
      else {
        pcVar3 = bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                           ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                            ((long)&cert.u + 0x18));
        x509_local._4_4_ = CBB_finish_i2d(pcVar3,outp);
      }
      goto LAB_00239e5d;
    }
  }
  x509_local._4_4_ = -1;
LAB_00239e5d:
  out._4_4_ = 1;
  bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::~StackAllocated
            ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)((long)&cert.u + 0x18));
  return x509_local._4_4_;
}

Assistant:

int i2d_X509(X509 *x509, uint8_t **outp) {
  if (x509 == NULL) {
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_MISSING_VALUE);
    return -1;
  }

  bssl::ScopedCBB cbb;
  CBB cert;
  if (!CBB_init(cbb.get(), 64) ||  //
      !CBB_add_asn1(cbb.get(), &cert, CBS_ASN1_SEQUENCE)) {
    return -1;
  }

  // TODO(crbug.com/boringssl/443): When the rest of the library is decoupled
  // from the tasn_*.c implementation, replace this with |CBS|-based functions.
  uint8_t *out;
  int len = i2d_X509_CINF(x509->cert_info, NULL);
  if (len < 0 ||  //
      !CBB_add_space(&cert, &out, static_cast<size_t>(len)) ||
      i2d_X509_CINF(x509->cert_info, &out) != len ||
      !x509_marshal_algorithm(&cert, x509->sig_alg) ||
      !asn1_marshal_bit_string(&cert, x509->signature, /*tag=*/0)) {
    return -1;
  }

  return CBB_finish_i2d(cbb.get(), outp);
}